

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
emplaceRealloc<slang::ast::ValueSymbol*&,slang::ast::PortSymbol*&>
          (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *this,
          pointer pos,ValueSymbol **args,PortSymbol **args_1)

{
  ulong uVar1;
  Symbol *pSVar2;
  pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*> *__cur_1;
  undefined8 *puVar3;
  pointer ppVar4;
  undefined8 *puVar5;
  pointer ppVar6;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar7;
  long lVar8;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar7 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar8 = (long)pos - *(long *)this;
  puVar3 = (undefined8 *)operator_new((long)pEVar7 << 4);
  *(ValueSymbol **)((long)puVar3 + lVar8) = *args;
  *(PortSymbol **)((long)puVar3 + lVar8 + 8) = *args_1;
  ppVar6 = *(pointer *)this;
  ppVar4 = ppVar6 + *(long *)(this + 8);
  puVar5 = puVar3;
  if (ppVar4 == pos) {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      pSVar2 = ppVar6->second;
      *puVar5 = ppVar6->first;
      puVar5[1] = pSVar2;
      puVar5 = puVar5 + 2;
    }
  }
  else {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      pSVar2 = ppVar6->second;
      *puVar5 = ppVar6->first;
      puVar5[1] = pSVar2;
      puVar5 = puVar5 + 2;
    }
    puVar5 = (undefined8 *)((long)puVar3 + lVar8);
    for (; pos != ppVar4; pos = pos + 1) {
      pSVar2 = pos->second;
      puVar5[2] = pos->first;
      puVar5[3] = pSVar2;
      puVar5 = puVar5 + 2;
    }
  }
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::cleanup
            ((SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)this,
             ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar7;
  *(undefined8 **)this = puVar3;
  return (pointer)((long)puVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}